

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# profiling_info.cpp
# Opt level: O1

void __thiscall duckdb::ProfilingInfo::ResetMetrics(ProfilingInfo *this)

{
  profiler_metrics_t *this_00;
  _Hash_node_base *__k;
  bool bVar1;
  Value *this_01;
  InternalException *this_02;
  long *plVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> **pp_Var3;
  char *value;
  _Hash_node_base *p_Var4;
  Value local_b0;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  this_00 = &this->metrics;
  ::std::
  _Hashtable<duckdb::MetricsType,_std::pair<const_duckdb::MetricsType,_duckdb::Value>,_std::allocator<std::pair<const_duckdb::MetricsType,_duckdb::Value>_>,_std::__detail::_Select1st,_std::equal_to<duckdb::MetricsType>,_duckdb::MetricsTypeHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::clear(&this_00->_M_h);
  p_Var4 = (this->expanded_settings)._M_h._M_before_begin._M_nxt;
  if (p_Var4 != (_Hash_node_base *)0x0) {
    do {
      __k = p_Var4 + 1;
      bVar1 = MetricsUtils::IsOptimizerMetric(*(MetricsType *)&p_Var4[1]._M_nxt);
      if ((bVar1) ||
         (bVar1 = MetricsUtils::IsPhaseTimingMetric(*(MetricsType *)&__k->_M_nxt), bVar1)) {
        Value::CreateValue<double>(&local_b0,0.0);
        this_01 = ::std::__detail::
                  _Map_base<duckdb::MetricsType,_std::pair<const_duckdb::MetricsType,_duckdb::Value>,_std::allocator<std::pair<const_duckdb::MetricsType,_duckdb::Value>_>,_std::__detail::_Select1st,_std::equal_to<duckdb::MetricsType>,_duckdb::MetricsTypeHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::operator[]((_Map_base<duckdb::MetricsType,_std::pair<const_duckdb::MetricsType,_duckdb::Value>,_std::allocator<std::pair<const_duckdb::MetricsType,_duckdb::Value>_>,_std::__detail::_Select1st,_std::equal_to<duckdb::MetricsType>,_duckdb::MetricsTypeHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                *)this_00,(key_type *)__k);
        goto LAB_004e019a;
      }
      switch(*(byte *)&__k->_M_nxt) {
      case 0:
        Value::CreateValue<char_const*>(&local_b0,(Value *)(anon_var_dwarf_643533f + 9),value);
        this_01 = ::std::__detail::
                  _Map_base<duckdb::MetricsType,_std::pair<const_duckdb::MetricsType,_duckdb::Value>,_std::allocator<std::pair<const_duckdb::MetricsType,_duckdb::Value>_>,_std::__detail::_Select1st,_std::equal_to<duckdb::MetricsType>,_duckdb::MetricsTypeHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::operator[]((_Map_base<duckdb::MetricsType,_std::pair<const_duckdb::MetricsType,_duckdb::Value>,_std::allocator<std::pair<const_duckdb::MetricsType,_duckdb::Value>_>,_std::__detail::_Select1st,_std::equal_to<duckdb::MetricsType>,_duckdb::MetricsTypeHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                *)this_00,(key_type *)__k);
        break;
      case 1:
      case 2:
      case 9:
      case 0xb:
        Value::CreateValue<double>(&local_b0,0.0);
        this_01 = ::std::__detail::
                  _Map_base<duckdb::MetricsType,_std::pair<const_duckdb::MetricsType,_duckdb::Value>,_std::allocator<std::pair<const_duckdb::MetricsType,_duckdb::Value>_>,_std::__detail::_Select1st,_std::equal_to<duckdb::MetricsType>,_duckdb::MetricsTypeHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::operator[]((_Map_base<duckdb::MetricsType,_std::pair<const_duckdb::MetricsType,_duckdb::Value>,_std::allocator<std::pair<const_duckdb::MetricsType,_duckdb::Value>_>,_std::__detail::_Select1st,_std::equal_to<duckdb::MetricsType>,_duckdb::MetricsTypeHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                *)this_00,(key_type *)__k);
        break;
      case 3:
        goto switchD_004e01d2_caseD_3;
      case 4:
      case 6:
      case 7:
      case 8:
      case 10:
      case 0xc:
      case 0xe:
      case 0xf:
        Value::CreateValue<unsigned_long>(&local_b0,0);
        this_01 = ::std::__detail::
                  _Map_base<duckdb::MetricsType,_std::pair<const_duckdb::MetricsType,_duckdb::Value>,_std::allocator<std::pair<const_duckdb::MetricsType,_duckdb::Value>_>,_std::__detail::_Select1st,_std::equal_to<duckdb::MetricsType>,_duckdb::MetricsTypeHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::operator[]((_Map_base<duckdb::MetricsType,_std::pair<const_duckdb::MetricsType,_duckdb::Value>,_std::allocator<std::pair<const_duckdb::MetricsType,_duckdb::Value>_>,_std::__detail::_Select1st,_std::equal_to<duckdb::MetricsType>,_duckdb::MetricsTypeHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                *)this_00,(key_type *)__k);
        break;
      case 5:
        Value::CreateValue<unsigned_char>(&local_b0,'\0');
        this_01 = ::std::__detail::
                  _Map_base<duckdb::MetricsType,_std::pair<const_duckdb::MetricsType,_duckdb::Value>,_std::allocator<std::pair<const_duckdb::MetricsType,_duckdb::Value>_>,_std::__detail::_Select1st,_std::equal_to<duckdb::MetricsType>,_duckdb::MetricsTypeHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::operator[]((_Map_base<duckdb::MetricsType,_std::pair<const_duckdb::MetricsType,_duckdb::Value>,_std::allocator<std::pair<const_duckdb::MetricsType,_duckdb::Value>_>,_std::__detail::_Select1st,_std::equal_to<duckdb::MetricsType>,_duckdb::MetricsTypeHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                *)this_00,(key_type *)__k);
        break;
      case 0xd:
        Value::CreateValue<char_const*>(&local_b0,(Value *)(anon_var_dwarf_643533f + 9),value);
        this_01 = ::std::__detail::
                  _Map_base<duckdb::MetricsType,_std::pair<const_duckdb::MetricsType,_duckdb::Value>,_std::allocator<std::pair<const_duckdb::MetricsType,_duckdb::Value>_>,_std::__detail::_Select1st,_std::equal_to<duckdb::MetricsType>,_duckdb::MetricsTypeHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::operator[]((_Map_base<duckdb::MetricsType,_std::pair<const_duckdb::MetricsType,_duckdb::Value>,_std::allocator<std::pair<const_duckdb::MetricsType,_duckdb::Value>_>,_std::__detail::_Select1st,_std::equal_to<duckdb::MetricsType>,_duckdb::MetricsTypeHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                *)this_00,(key_type *)__k);
        break;
      default:
        this_02 = (InternalException *)__cxa_allocate_exception(0x10);
        EnumUtil::ToString<duckdb::MetricsType>(&local_70,*(MetricsType *)&__k->_M_nxt);
        ::std::operator+(&local_50,"MetricsType",&local_70);
        plVar2 = (long *)::std::__cxx11::string::append((char *)&local_50);
        local_b0.type_._0_8_ = *plVar2;
        pp_Var3 = (__shared_count<(__gnu_cxx::_Lock_policy)2> **)(plVar2 + 2);
        if ((__shared_count<(__gnu_cxx::_Lock_policy)2> **)local_b0.type_._0_8_ == pp_Var3) {
          local_b0.type_.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)*pp_Var3;
          local_b0._24_8_ = plVar2[3];
          local_b0.type_._0_8_ =
               &local_b0.type_.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
        }
        else {
          local_b0.type_.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)*pp_Var3;
        }
        local_b0.type_.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)plVar2[1];
        *plVar2 = (long)pp_Var3;
        plVar2[1] = 0;
        *(undefined1 *)(plVar2 + 2) = 0;
        InternalException::InternalException(this_02,(string *)&local_b0);
        __cxa_throw(this_02,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
      }
LAB_004e019a:
      Value::operator=(this_01,&local_b0);
      Value::~Value(&local_b0);
switchD_004e01d2_caseD_3:
      p_Var4 = p_Var4->_M_nxt;
    } while (p_Var4 != (_Hash_node_base *)0x0);
  }
  return;
}

Assistant:

void ProfilingInfo::ResetMetrics() {
	metrics.clear();
	for (auto &metric : expanded_settings) {
		if (MetricsUtils::IsOptimizerMetric(metric) || MetricsUtils::IsPhaseTimingMetric(metric)) {
			metrics[metric] = Value::CreateValue(0.0);
			continue;
		}

		switch (metric) {
		case MetricsType::QUERY_NAME:
			metrics[metric] = Value::CreateValue("");
			break;
		case MetricsType::LATENCY:
		case MetricsType::BLOCKED_THREAD_TIME:
		case MetricsType::CPU_TIME:
		case MetricsType::OPERATOR_TIMING:
			metrics[metric] = Value::CreateValue(0.0);
			break;
		case MetricsType::OPERATOR_NAME:
			metrics[metric] = Value::CreateValue("");
			break;
		case MetricsType::OPERATOR_TYPE:
			metrics[metric] = Value::CreateValue<uint8_t>(0);
			break;
		case MetricsType::ROWS_RETURNED:
		case MetricsType::RESULT_SET_SIZE:
		case MetricsType::CUMULATIVE_CARDINALITY:
		case MetricsType::OPERATOR_CARDINALITY:
		case MetricsType::CUMULATIVE_ROWS_SCANNED:
		case MetricsType::OPERATOR_ROWS_SCANNED:
		case MetricsType::SYSTEM_PEAK_BUFFER_MEMORY:
		case MetricsType::SYSTEM_PEAK_TEMP_DIR_SIZE:
			metrics[metric] = Value::CreateValue<uint64_t>(0);
			break;
		case MetricsType::EXTRA_INFO:
			break;
		default:
			throw InternalException("MetricsType" + EnumUtil::ToString(metric) + "not implemented");
		}
	}
}